

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_vector.hpp
# Opt level: O0

void __thiscall
tlx::SimpleVector<foxxll::BID<0UL>,_(tlx::SimpleVectorMode)0>::resize
          (SimpleVector<foxxll::BID<0UL>,_(tlx::SimpleVectorMode)0> *this,size_type new_size)

{
  BID<0UL> *pBVar1;
  unsigned_long *puVar2;
  BID<0UL> *pBVar3;
  value_type *tmp;
  size_type new_size_local;
  SimpleVector<foxxll::BID<0UL>,_(tlx::SimpleVectorMode)0> *this_local;
  
  tmp = (value_type *)new_size;
  new_size_local = (size_type)this;
  if (this->array_ == (value_type *)0x0) {
    pBVar3 = create_array(new_size);
    this->array_ = pBVar3;
    this->size_ = (size_type)tmp;
  }
  else {
    pBVar3 = this->array_;
    pBVar1 = create_array(new_size);
    this->array_ = pBVar1;
    puVar2 = std::min<unsigned_long>(&this->size_,(unsigned_long *)&tmp);
    std::move<foxxll::BID<0ul>*,foxxll::BID<0ul>*>(pBVar3,pBVar3 + *puVar2,this->array_);
    destroy_array(pBVar3,this->size_);
    this->size_ = (size_type)tmp;
  }
  return;
}

Assistant:

void resize(size_type new_size) {
        if (array_) {
            value_type* tmp = array_;
            array_ = create_array(new_size);
            std::move(tmp, tmp + std::min(size_, new_size), array_);
            destroy_array(tmp, size_);
            size_ = new_size;
        }
        else {
            array_ = create_array(new_size);
            size_ = new_size;
        }
    }